

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_blurshader.cpp
# Opt level: O2

void __thiscall
FBlurShader::Blur(FBlurShader *this,FGLRenderer *renderer,float blurAmount,int sampleCount,
                 GLuint inputTexture,GLuint outputFrameBuffer,int width,int height,bool vertical)

{
  BlurSetup *pBVar1;
  
  pBVar1 = GetSetup(this,blurAmount,sampleCount);
  FShaderProgram::Bind
            ((&pBVar1->VerticalShader)[!vertical].
             super___shared_ptr<FShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (*_ptrc_glActiveTexture)(0x84c0);
  (*_ptrc_glBindTexture)(0xde1,inputTexture);
  (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2600);
  (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2600);
  (*_ptrc_glTexParameteri)(0xde1,0x2802,0x812f);
  (*_ptrc_glTexParameteri)(0xde1,0x2803,0x812f);
  (*_ptrc_glBindFramebuffer)(0x8d40,outputFrameBuffer);
  (*_ptrc_glViewport)(0,0,width,height);
  (*_ptrc_glDisable)(0xbe2);
  FGLRenderer::RenderScreenQuad(renderer);
  return;
}

Assistant:

void FBlurShader::Blur(FGLRenderer *renderer, float blurAmount, int sampleCount, GLuint inputTexture, GLuint outputFrameBuffer, int width, int height, bool vertical)
{
	BlurSetup *setup = GetSetup(blurAmount, sampleCount);
	if (vertical)
		setup->VerticalShader->Bind();
	else
		setup->HorizontalShader->Bind();

	glActiveTexture(GL_TEXTURE0);
	glBindTexture(GL_TEXTURE_2D, inputTexture);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

	glBindFramebuffer(GL_FRAMEBUFFER, outputFrameBuffer);
	glViewport(0, 0, width, height);
	glDisable(GL_BLEND);

	renderer->RenderScreenQuad();
}